

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

void gray_render_cubic(PWorker worker,PVG_FT_Vector *control1,PVG_FT_Vector *control2,
                      PVG_FT_Vector *to)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long local_3c8;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  TPos s_limit;
  TPos s;
  TPos L;
  TPos dy2;
  TPos dx2;
  TPos dy1;
  TPos dx1;
  TPos dy_;
  TPos dx_;
  TPos dy;
  TPos dx;
  PVG_FT_Vector *limit;
  PVG_FT_Vector *arc;
  PVG_FT_Vector bez_stack [49];
  PVG_FT_Vector *to_local;
  PVG_FT_Vector *control2_local;
  PVG_FT_Vector *control1_local;
  PWorker worker_local;
  
  limit = (PVG_FT_Vector *)&arc;
  arc = (PVG_FT_Vector *)(to->x << 2);
  bez_stack[0].x = to->y << 2;
  bez_stack[0].y = control2->x << 2;
  bez_stack[1].x = control2->y << 2;
  bez_stack[1].y = control1->x << 2;
  bez_stack[2].x = control1->y << 2;
  bez_stack[2].y = worker->x;
  bez_stack[3].x = worker->y;
  lVar1 = bez_stack[1].x >> 8;
  lVar2 = bez_stack[2].x >> 8;
  lVar3 = worker->y >> 8;
  if (((((worker->max_ey <= bez_stack[0].x >> 8) && (worker->max_ey <= lVar1)) &&
       (worker->max_ey <= lVar2)) && (worker->max_ey <= lVar3)) ||
     (((bez_stack[0x30].y = (PVG_FT_Pos)to, bez_stack[0].x >> 8 < worker->min_ey &&
       (lVar1 < worker->min_ey)) && ((lVar2 < worker->min_ey && (lVar3 < worker->min_ey)))))) {
    worker->x = (TPos)arc;
    worker->y = bez_stack[0].x;
    return;
  }
  do {
    while( true ) {
      lVar1 = limit[3].x - limit->x;
      lVar2 = limit[3].y - limit->y;
      local_3a8 = lVar1;
      if (lVar1 < 0) {
        local_3a8 = -lVar1;
      }
      local_3b0 = lVar2;
      if (lVar2 < 0) {
        local_3b0 = -lVar2;
      }
      if (local_3b0 < local_3a8) {
        local_3b8 = local_3a8 + (local_3b0 * 3 >> 3);
      }
      else {
        local_3b8 = local_3b0 + (local_3a8 * 3 >> 3);
      }
      if (local_3b8 < 0x800000) break;
LAB_00131805:
      if (limit == (PVG_FT_Vector *)&bez_stack[0x2c].y) {
        return;
      }
      gray_split_cubic(limit);
      limit = limit + 3;
    }
    lVar3 = limit[1].x - limit->x;
    lVar4 = limit[1].y - limit->y;
    if (lVar2 * lVar3 - lVar1 * lVar4 < 0) {
      local_3c0 = -(lVar2 * lVar3 - lVar1 * lVar4);
    }
    else {
      local_3c0 = lVar2 * lVar3 - lVar1 * lVar4;
    }
    if (local_3b8 * 0x2a < local_3c0) goto LAB_00131805;
    lVar5 = limit[2].x - limit->x;
    lVar6 = limit[2].y - limit->y;
    if (lVar2 * lVar5 - lVar1 * lVar6 < 0) {
      local_3c8 = -(lVar2 * lVar5 - lVar1 * lVar6);
    }
    else {
      local_3c8 = lVar2 * lVar5 - lVar1 * lVar6;
    }
    if (((local_3b8 * 0x2a < local_3c8) || (0 < lVar3 * (lVar3 - lVar1) + lVar4 * (lVar4 - lVar2)))
       || (0 < lVar5 * (lVar5 - lVar1) + lVar6 * (lVar6 - lVar2))) goto LAB_00131805;
    gray_render_line(worker,limit->x,limit->y);
    if (limit == (PVG_FT_Vector *)&arc) {
      return;
    }
    limit = limit + -3;
  } while( true );
}

Assistant:

static void
  gray_render_cubic( RAS_ARG_ const PVG_FT_Vector*  control1,
                              const PVG_FT_Vector*  control2,
                              const PVG_FT_Vector*  to )
  {
    PVG_FT_Vector   bez_stack[16 * 3 + 1];  /* enough to accommodate bisections */
    PVG_FT_Vector*  arc = bez_stack;
    PVG_FT_Vector*  limit = bez_stack + 45;
    TPos        dx, dy, dx_, dy_;
    TPos        dx1, dy1, dx2, dy2;
    TPos        L, s, s_limit;


    arc[0].x = UPSCALE( to->x );
    arc[0].y = UPSCALE( to->y );
    arc[1].x = UPSCALE( control2->x );
    arc[1].y = UPSCALE( control2->y );
    arc[2].x = UPSCALE( control1->x );
    arc[2].y = UPSCALE( control1->y );
    arc[3].x = ras.x;
    arc[3].y = ras.y;

    /* short-cut the arc that crosses the current band */
    if ( ( TRUNC( arc[0].y ) >= ras.max_ey &&
           TRUNC( arc[1].y ) >= ras.max_ey &&
           TRUNC( arc[2].y ) >= ras.max_ey &&
           TRUNC( arc[3].y ) >= ras.max_ey ) ||
         ( TRUNC( arc[0].y ) <  ras.min_ey &&
           TRUNC( arc[1].y ) <  ras.min_ey &&
           TRUNC( arc[2].y ) <  ras.min_ey &&
           TRUNC( arc[3].y ) <  ras.min_ey ) )
    {
      ras.x = arc[0].x;
      ras.y = arc[0].y;
      return;
    }

    for (;;)
    {
      /* Decide whether to split or draw. See `Rapid Termination          */
      /* Evaluation for Recursive Subdivision of Bezier Curves' by Thomas */
      /* F. Hain, at                                                      */
      /* http://www.cis.southalabama.edu/~hain/general/Publications/Bezier/Camera-ready%20CISST02%202.pdf */


      /* dx and dy are x and y components of the P0-P3 chord vector. */
      dx = dx_ = arc[3].x - arc[0].x;
      dy = dy_ = arc[3].y - arc[0].y;

      L = PVG_FT_HYPOT( dx_, dy_ );

      /* Avoid possible arithmetic overflow below by splitting. */
      if ( L >= (1 << 23) )
        goto Split;

      /* Max deviation may be as much as (s/L) * 3/4 (if Hain's v = 1). */
      s_limit = L * (TPos)( ONE_PIXEL / 6 );

      /* s is L * the perpendicular distance from P1 to the line P0-P3. */
      dx1 = arc[1].x - arc[0].x;
      dy1 = arc[1].y - arc[0].y;
      s = PVG_FT_ABS( dy * dx1 - dx * dy1 );

      if ( s > s_limit )
        goto Split;

      /* s is L * the perpendicular distance from P2 to the line P0-P3. */
      dx2 = arc[2].x - arc[0].x;
      dy2 = arc[2].y - arc[0].y;
      s = PVG_FT_ABS( dy * dx2 - dx * dy2 );

      if ( s > s_limit )
        goto Split;

      /* Split super curvy segments where the off points are so far
         from the chord that the angles P0-P1-P3 or P0-P2-P3 become
         acute as detected by appropriate dot products. */
      if ( dx1 * ( dx1 - dx ) + dy1 * ( dy1 - dy ) > 0 ||
           dx2 * ( dx2 - dx ) + dy2 * ( dy2 - dy ) > 0 )
        goto Split;

      gray_render_line( RAS_VAR_ arc[0].x, arc[0].y );

      if ( arc == bez_stack )
        return;

      arc -= 3;
      continue;

    Split:
      if( arc == limit )
        return;
      gray_split_cubic( arc );
      arc += 3;
    }
  }